

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall asl::HttpServer::HttpServer(HttpServer *this,int port)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  String local_78;
  String local_60;
  String local_48;
  String local_30;
  int local_14;
  HttpServer *pHStack_10;
  int port_local;
  HttpServer *this_local;
  
  local_14 = port;
  pHStack_10 = this;
  SocketServer::SocketServer(&this->super_SocketServer);
  (this->super_SocketServer)._vptr_SocketServer = (_func_int **)&PTR_serve_0018c828;
  asl::String::String(&this->_webroot);
  asl::String::String(&this->_proto,"HTTP/1.1");
  Dic<asl::String>::Dic(&this->_mimetypes);
  asl::String::String(&this->_methods,"GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD");
  (this->super_SocketServer)._requestStop = false;
  if (-1 < local_14) {
    SocketServer::bind(&this->super_SocketServer,local_14,__addr,in_ECX);
  }
  this->_wsserver = (WebSocketServer *)0x0;
  this->_cors = false;
  asl::String::String(&local_48,
                      "css:text/css,gif:image/gif,htm:text/html,html:text/html,jpeg:image/jpeg,jpg:image/jpeg,js:application/javascript,json:application/json,png:image/png,txt:text/plain,mp4:video/mp4,ogv:video/ogg,webm:video/webm,xml:text/xml"
                     );
  asl::String::String(&local_60,',');
  asl::String::String(&local_78,':');
  asl::String::split(&local_30,&local_48,&local_60);
  Dic<asl::String>::operator=(&this->_mimetypes,(Dic<asl::String> *)&local_30);
  Dic<asl::String>::~Dic((Dic<asl::String> *)&local_30);
  asl::String::~String(&local_78);
  asl::String::~String(&local_60);
  asl::String::~String(&local_48);
  return;
}

Assistant:

HttpServer::HttpServer(int port):
	_proto("HTTP/1.1"),
	_methods("GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD")
{
	_requestStop = false;
	if (port >= 0)
		bind(port);
	_wsserver = NULL;
	_cors = false;
	_mimetypes = String(
		"css:text/css,"
		"gif:image/gif,"
		"htm:text/html,"
		"html:text/html,"
		"jpeg:image/jpeg,"
		"jpg:image/jpeg,"
		"js:application/javascript,"
		"json:application/json,"
		"png:image/png,"
		"txt:text/plain,"
		"mp4:video/mp4,"
		"ogv:video/ogg,"
		"webm:video/webm,"
		"xml:text/xml"
		).split(',', ':');
}